

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O2

void rrot8(void *blob,int len,int c)

{
  undefined1 uVar1;
  uint uVar2;
  ulong uVar3;
  int nbytes;
  undefined1 uVar4;
  uint uVar5;
  
  if (c != 0) {
    uVar2 = len - 1;
    for (uVar5 = 0; uVar5 != (~(c / 8 >> 0x1f) & c / 8); uVar5 = uVar5 + 1) {
      uVar1 = *blob;
      for (uVar3 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar3; uVar3 = uVar3 + 1) {
        *(undefined1 *)((long)blob + uVar3) = *(undefined1 *)((long)blob + uVar3 + 1);
      }
      *(undefined1 *)((long)blob + (long)(int)uVar2) = uVar1;
    }
    if ((c & 7U) != 0) {
      uVar1 = *blob;
      for (uVar3 = 0; (uint)(~(len >> 0x1f) & len) != uVar3; uVar3 = uVar3 + 1) {
        uVar4 = uVar1;
        if (uVar2 != uVar3) {
          uVar4 = *(undefined1 *)((long)blob + uVar3 + 1);
        }
        *(char *)((long)blob + uVar3) =
             (char)(CONCAT11(uVar4,*(undefined1 *)((long)blob + uVar3)) >> ((byte)c & 7));
      }
    }
  }
  return;
}

Assistant:

void rrot8 ( void * blob, int len, int c )
{
  int nbytes  = len;

  uint8_t * k = (uint8_t*)blob;

  if(c == 0) return;

  //----------

  int b = c / 8;
  c &= (8-1);

  for(int j = 0; j < b; j++)
  {
    uint8_t t = k[0];

    for(int i = 0; i < nbytes-1; i++)
    {
      k[i] = k[i+1];
    }

    k[nbytes-1] = t;
  }

  if(c == 0) return;

  //----------

  uint8_t t = k[0];

  for(int i = 0; i < nbytes; i++)
  {
    uint8_t a = (i == nbytes-1) ? t : k[i+1];
    uint8_t b = k[i];

    k[i] = (a << (8-c)) | (b >> c);
  }
}